

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O2

void ihevc_buf_mgr_init(buf_mgr_t *ps_buf_mgr)

{
  long lVar1;
  
  ps_buf_mgr->u4_max_buf_cnt = 0x40;
  ps_buf_mgr->u4_active_buf_cnt = 0;
  for (lVar1 = -0x100; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)ps_buf_mgr->apv_ptr + lVar1) = 0;
    *(undefined8 *)((long)ps_buf_mgr[1].au4_status + lVar1 * 2 + -8) = 0;
  }
  return;
}

Assistant:

void ihevc_buf_mgr_init(
                buf_mgr_t *ps_buf_mgr)
{
    WORD32 id;

    ps_buf_mgr->u4_max_buf_cnt = BUF_MGR_MAX_CNT;
    ps_buf_mgr->u4_active_buf_cnt = 0;

    for(id = 0; id < BUF_MGR_MAX_CNT; id++)
    {
        ps_buf_mgr->au4_status[id] = 0;
        ps_buf_mgr->apv_ptr[id] = NULL;
    }
}